

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O3

void __thiscall
llm_tokenizer_ugm::llm_tokenizer_ugm
          (llm_tokenizer_ugm *this,llama_vocab *vocab,
          vector<char,_std::allocator<char>_> *precompiled_charsmap)

{
  ulong uVar1;
  _Rb_tree_header *p_Var2;
  uint *puVar3;
  _Head_base<0UL,_llama_vocab::impl_*,_false> _Var4;
  bool bVar5;
  ulong uVar6;
  token_data *ptVar7;
  runtime_error *this_00;
  uint uVar8;
  float fVar9;
  
  (this->super_llm_tokenizer)._vptr_llm_tokenizer = (_func_int **)&PTR__llm_tokenizer_ugm_00286350;
  (this->escaped_space)._M_dataplus._M_p = (pointer)&(this->escaped_space).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->escaped_space,anon_var_dwarf_3afc8e,anon_var_dwarf_3afc8e + 3);
  p_Var2 = &(this->user_defined_token_matcher).children._M_t._M_impl.super__Rb_tree_header;
  (this->user_defined_token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->user_defined_token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  this->prefix_replacements = (char *)0x0;
  this->prefix_replacements_size = 0;
  this->xcda_array = (uint32_t *)0x0;
  this->xcda_array_size = 0;
  (this->user_defined_token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->user_defined_token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var2->_M_header;
  (this->user_defined_token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->user_defined_token_matcher).has_value = false;
  (this->user_defined_token_matcher).value = 0;
  this->min_score = 3.4028235e+38;
  this->max_score = -3.4028235e+38;
  this->unknown_token_score_penalty = 10.0;
  p_Var2 = &(this->token_matcher).children._M_t._M_impl.super__Rb_tree_header;
  (this->token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->token_matcher).has_value = false;
  (this->token_matcher).value = 0;
  puVar3 = (uint *)(precompiled_charsmap->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  uVar6 = (long)(precompiled_charsmap->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar3;
  if (uVar6 != 0) {
    uVar8 = *puVar3;
    uVar1 = (ulong)uVar8 + 4;
    if (uVar6 < uVar1 || uVar6 - uVar1 == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Index out of array bounds in precompiled charsmap!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->xcda_array = puVar3 + 1;
    this->xcda_array_size = (ulong)(uVar8 >> 2);
    this->prefix_replacements = (char *)(uVar1 + (long)puVar3);
    this->prefix_replacements_size = uVar6 - uVar1;
  }
  _Var4._M_head_impl =
       (vocab->pimpl)._M_t.
       super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>._M_t.
       super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>.
       super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl;
  if ((int)((ulong)((long)*(pointer *)((long)&(_Var4._M_head_impl)->id_to_token + 8) -
                   *(long *)&((_Var4._M_head_impl)->id_to_token).
                             super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                   ) >> 3) * -0x33333333 == 0) {
    fVar9 = 3.4028235e+38;
  }
  else {
    uVar8 = 0;
    do {
      ptVar7 = llama_vocab::get_token_data(vocab,uVar8);
      bVar5 = llama_vocab::impl::is_normal
                        ((vocab->pimpl)._M_t.
                         super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                         .super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl,uVar8);
      if (bVar5) {
        fVar9 = ptVar7->score;
        if (this->min_score <= ptVar7->score) {
          fVar9 = this->min_score;
        }
        this->min_score = fVar9;
        fVar9 = ptVar7->score;
        if (ptVar7->score <= this->max_score) {
          fVar9 = this->max_score;
        }
        this->max_score = fVar9;
      }
      bVar5 = llama_vocab::impl::is_normal
                        ((vocab->pimpl)._M_t.
                         super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                         .super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl,uVar8);
      if (bVar5) {
LAB_0021ea0c:
        naive_trie::insert(&this->token_matcher,(ptVar7->text)._M_dataplus._M_p,
                           (ptVar7->text)._M_string_length,uVar8);
      }
      else {
        bVar5 = llama_vocab::impl::is_user_defined
                          ((vocab->pimpl)._M_t.
                           super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                           .super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl,uVar8);
        if (bVar5) goto LAB_0021ea0c;
        bVar5 = llama_vocab::impl::is_unused
                          ((vocab->pimpl)._M_t.
                           super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                           .super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl,uVar8);
        if (bVar5) goto LAB_0021ea0c;
      }
      bVar5 = llama_vocab::impl::is_user_defined
                        ((vocab->pimpl)._M_t.
                         super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                         .super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl,uVar8);
      if (bVar5) {
        naive_trie::insert(&this->user_defined_token_matcher,(ptVar7->text)._M_dataplus._M_p,
                           (ptVar7->text)._M_string_length,0);
      }
      _Var4._M_head_impl =
           (vocab->pimpl)._M_t.
           super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>._M_t.
           super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>.
           super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl;
      uVar8 = uVar8 + 1;
    } while (uVar8 < (uint)((int)((ulong)((long)*(pointer *)
                                                 ((long)&(_Var4._M_head_impl)->id_to_token + 8) -
                                         *(long *)&((_Var4._M_head_impl)->id_to_token).
                                                                                                      
                                                  super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                                         ) >> 3) * -0x33333333));
    fVar9 = this->min_score - this->unknown_token_score_penalty;
  }
  this->unknown_token_score = fVar9;
  return;
}

Assistant:

llm_tokenizer_ugm(const llama_vocab & vocab, const std::vector<char> & precompiled_charsmap) {
        if (precompiled_charsmap.size() > 0) {
            size_t charsmap_offset = 0;

            // First four bytes of precompiled_charsmap contains length of binary
            // blob containing XOR-compressed compact double array (XCDA) entries
            uint32_t xcda_blob_size = *(const uint32_t *) &precompiled_charsmap[0];
            charsmap_offset += sizeof(xcda_blob_size);
            if (xcda_blob_size + charsmap_offset >= precompiled_charsmap.size()) {
                throw std::runtime_error("Index out of array bounds in precompiled charsmap!");
            }

            // Next xcda_blob_size bytes contain entries of XOR-compressed compact
            // double array (XCDA). Each entry is bit-packed into a 32-bit integer.
            xcda_array = (const uint32_t *) &precompiled_charsmap[charsmap_offset];
            xcda_array_size = xcda_blob_size / sizeof(uint32_t);
            charsmap_offset += xcda_blob_size;

            // Remaining bytes of precompiled charsmap contain null-terminated
            // replacement strings for prefixes matched by the XCDA.
            prefix_replacements = &precompiled_charsmap[charsmap_offset];
            prefix_replacements_size = precompiled_charsmap.size() - charsmap_offset;
        }

        for (uint32_t id = 0; id < vocab.n_tokens(); ++id) {
            const auto & token_data = vocab.get_token_data(id);

            if (vocab.is_normal(id)) {
                min_score = std::min<float>(min_score, token_data.score);
                max_score = std::max<float>(max_score, token_data.score);
            }

            if (vocab.is_normal(id) ||
                vocab.is_user_defined(id) ||
                vocab.is_unused(id)) {
                token_matcher.insert(token_data.text.data(), token_data.text.size(), id);
            }

            if (vocab.is_user_defined(id)) {
                user_defined_token_matcher.insert(token_data.text.data(), token_data.text.size());
            }
        }

        unknown_token_score = min_score - unknown_token_score_penalty;
    }